

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeFinalizing.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_35::TypeFinalizing::TypeFinalizing(TypeFinalizing *this,bool finalize)

{
  bool finalize_local;
  TypeFinalizing *this_local;
  
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__TypeFinalizing_030a19e8;
  this->finalize = finalize;
  std::
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  ::unordered_set(&this->modifiableTypes);
  return;
}

Assistant:

TypeFinalizing(bool finalize) : finalize(finalize) {}